

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O2

void mxx::custom_op<float>::custom_function<mymax<float>>
               (long param_1,long param_2,int *param_3,undefined8 *param_4)

{
  float fVar1;
  int iVar2;
  ulong uVar3;
  void *__src;
  float fVar4;
  float inout_buf;
  float in_buf;
  MPI_Aint true_lb;
  MPI_Aint true_extent;
  undefined1 local_48 [4];
  undefined1 local_44 [4];
  long local_40;
  size_t local_38;
  
  iVar2 = *param_3;
  if (1 < iVar2) {
    for (uVar3 = 0; iVar2 - 1 != uVar3; uVar3 = uVar3 + 1) {
      fVar4 = *(float *)(param_1 + uVar3 * 4);
      fVar1 = *(float *)(param_2 + uVar3 * 4);
      if (fVar4 <= fVar1) {
        fVar4 = fVar1;
      }
      *(float *)(param_2 + uVar3 * 4) = fVar4;
    }
  }
  MPI_Type_get_true_extent(*param_4,&local_40,&local_38);
  iVar2 = *param_3;
  memcpy(local_44 + local_40,(void *)(param_1 + (long)iVar2 * 4 + -4),local_38);
  __src = (void *)(param_2 + (long)iVar2 * 4 + -4);
  memcpy(local_48 + local_40,__src,local_38);
  memcpy(__src,local_48 + local_40,local_38);
  return;
}

Assistant:

static void custom_function(Func func, void* invec, void* inoutvec, int* len, MPI_Datatype* dt) {
        if (*len > 1) {
            T* in = (T*) invec;
            T* inout = (T*) inoutvec;
            for (int i = 0; i < *len-1; ++i) {
                inout[i] = func(in[i], inout[i]);
            }
        }
        // only read and write the `true_extent` of the datatype
        // for the last item (otherwise we might encounter a memory error)
        // [see github OpenMPI issue #1462]
        T in_buf;
        T inout_buf;
        MPI_Aint true_extent, true_lb;
        MPI_Type_get_true_extent(*dt, &true_lb, &true_extent);
        std::memcpy((char*)&in_buf+true_lb, (char*)invec+(sizeof(T)*(*len-1)), true_extent);
        std::memcpy((char*)&inout_buf+true_lb, (char*)inoutvec+(sizeof(T)*(*len-1)), true_extent);
        // now do the operation on our local buffers
        inout_buf = func(in_buf, inout_buf);
        // copy the results back, again only to true_extent
        std::memcpy((char*)inoutvec+(sizeof(T)*(*len - 1)), (char*)&inout_buf+true_lb, true_extent);
    }